

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O1

Abc_Obj_t * Abc_NtkFindOrCreateNet(Abc_Ntk_t *pNtk,char *pName)

{
  Abc_Obj_t *pAVar1;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x24d,"Abc_Obj_t *Abc_NtkFindOrCreateNet(Abc_Ntk_t *, char *)");
  }
  if ((pName != (char *)0x0) && (pAVar1 = Abc_NtkFindNet(pNtk,pName), pAVar1 != (Abc_Obj_t *)0x0)) {
    return pAVar1;
  }
  pAVar1 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NET);
  if (pName != (char *)0x0) {
    Nm_ManStoreIdName(pNtk->pManName,pAVar1->Id,*(uint *)&pAVar1->field_0x14 & 0xf,pName,(char *)0x0
                     );
  }
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_NtkFindOrCreateNet( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet;
    assert( Abc_NtkIsNetlist(pNtk) );
    if ( pName && (pNet = Abc_NtkFindNet( pNtk, pName )) )
        return pNet;
//printf( "Creating net %s.\n", pName );
    // create a new net
    pNet = Abc_NtkCreateNet( pNtk );
    if ( pName )
        Nm_ManStoreIdName( pNtk->pManName, pNet->Id, pNet->Type, pName, NULL );
    return pNet;
}